

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O2

void calc_statistics(float (*correct_vels) [512] [2],float (*norm_vels1) [512] [2],
                    float (*norm_vels2) [512] [2],int int_size_x,int int_size_y,
                    float (*full_vels) [512] [2],float (*E) [512],int pic_x,int pic_y,int n,
                    float *ave_error,float *st_dev,float *density,float *residual,float *min_angle,
                    float *max_angle,float *norm_ave_error1,float *norm_st_dev1,float *norm_density1
                    ,float *norm_min_angle1,float *norm_max_angle1,float *norm_ave_error2,
                    float *norm_st_dev2,float *norm_density2,float *norm_min_angle2,
                    float *norm_max_angle2)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  FILE *__stream;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  double dVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float uve [2];
  ulong local_5d8;
  undefined8 local_5b8;
  uint local_5b0;
  uint local_5ac;
  uint local_5a8;
  uint local_5a4;
  float *local_5a0;
  float *local_598;
  float *local_590;
  long local_588;
  float *local_580;
  float *local_578;
  float *local_570;
  undefined8 local_568;
  undefined8 uStack_560;
  float *local_550;
  float *local_548;
  float *local_540;
  float *local_538;
  float *local_530;
  float *local_528;
  float *local_520;
  long local_518;
  float *local_510;
  float *local_508;
  float *local_500;
  long local_4f8;
  long local_4f0;
  float histogram_error2 [100];
  float histogram_error [100];
  int histogram_count [100];
  
  local_5a0 = norm_max_angle2;
  local_550 = norm_density2;
  local_540 = norm_st_dev2;
  local_590 = norm_ave_error2;
  local_548 = norm_st_dev1;
  local_598 = norm_ave_error1;
  local_580 = min_angle;
  *min_angle = INFINITY;
  local_578 = norm_min_angle1;
  *norm_min_angle1 = INFINITY;
  local_530 = max_angle;
  *max_angle = 0.0;
  local_528 = norm_max_angle1;
  *norm_max_angle1 = 0.0;
  local_570 = norm_min_angle2;
  *norm_min_angle2 = INFINITY;
  *norm_max_angle2 = 0.0;
  local_538 = residual;
  *residual = 0.0;
  local_510 = density;
  *density = 0.0;
  local_500 = st_dev;
  *st_dev = 0.0;
  *ave_error = 0.0;
  local_508 = norm_density1;
  *norm_density1 = 0.0;
  *norm_st_dev1 = 0.0;
  *norm_ave_error1 = 0.0;
  *norm_density2 = 0.0;
  *norm_st_dev2 = 0.0;
  *norm_ave_error2 = 0.0;
  for (lVar12 = 0; lVar12 != 100; lVar12 = lVar12 + 1) {
    histogram_error2[lVar12] = 0.0;
    histogram_error[lVar12] = 0.0;
    histogram_count[lVar12] = 0;
  }
  local_520 = ave_error;
  lVar15 = (long)n;
  local_4f8 = (long)(pic_x - n);
  lVar12 = lVar15 * 0x1008;
  lVar11 = (long)full_vels + lVar12 + 4;
  lVar10 = (long)correct_vels + lVar12;
  local_588 = (long)E + lVar15 * 0x804;
  lVar14 = (long)norm_vels1 + lVar12 + 4;
  lVar16 = (long)norm_vels2 + lVar12 + 4;
  local_518 = (long)Imag + lVar15 * 0x804;
  fVar21 = 0.0;
  uVar8 = 0;
  local_5a4 = 0;
  fVar22 = 0.0;
  local_568 = 0;
  uStack_560 = 0;
  local_5ac = 0;
  local_5b0 = 0;
  local_5d8 = 0;
  local_5a8 = 0;
  uVar7 = 0;
  lVar12 = lVar15;
  do {
    pfVar6 = local_520;
    pfVar5 = local_528;
    pfVar4 = local_530;
    pfVar3 = local_590;
    pfVar2 = local_598;
    if (local_4f8 <= lVar12) {
      fVar24 = (float)(int)uVar7;
      fVar17 = (float)(int)local_5b0;
      fVar19 = (float)(int)uVar8;
      *local_510 = (fVar24 * 100.0) / fVar17;
      fVar18 = (float)(int)local_5d8;
      *local_508 = (fVar19 * 100.0) / fVar17;
      *local_550 = (fVar18 * 100.0) / fVar17;
      fVar17 = 0.0;
      fVar23 = 0.0;
      if (uVar7 != 0) {
        fVar23 = *local_520 / fVar24;
      }
      *local_520 = fVar23;
      if (uVar8 != 0) {
        fVar17 = *local_598 / fVar19;
      }
      *local_598 = fVar17;
      fVar17 = 0.0;
      fVar23 = 0.0;
      if ((int)local_5d8 != 0) {
        fVar23 = *local_590 / fVar18;
      }
      *local_590 = fVar23;
      if (1 < (int)uVar7) {
        fVar17 = SQRT(ABS(((float)local_568 - fVar24 * *local_520 * *local_520) /
                          (float)(int)(uVar7 - 1)));
      }
      *local_500 = fVar17;
      fVar17 = 0.0;
      if (1 < (int)uVar8) {
        fVar17 = (fVar21 - fVar19 * *local_598 * *local_598) / (float)(int)(uVar8 - 1);
        if (fVar17 < 0.0) {
          local_568 = CONCAT44(local_568._4_4_,fVar18);
          fVar17 = sqrtf(fVar17);
          fVar18 = (float)local_568;
        }
        else {
          fVar17 = SQRT(fVar17);
        }
      }
      fVar21 = 0.0;
      *local_548 = fVar17;
      if (1 < (int)local_5d8) {
        fVar21 = *pfVar3;
        fVar21 = (fVar22 - fVar18 * fVar21 * fVar21) / (float)((int)local_5d8 + -1);
        if (fVar21 < 0.0) {
          fVar21 = sqrtf(fVar21);
        }
        else {
          fVar21 = SQRT(fVar21);
        }
      }
      *local_540 = fVar21;
      if (uVar7 != 0) {
        *local_538 = *local_538 / fVar24;
      }
      if ((*pfVar6 == 0.0) && (!NAN(*pfVar6))) {
        *pfVar4 = 0.0;
        *local_580 = 0.0;
      }
      if ((*pfVar2 == 0.0) && (!NAN(*pfVar2))) {
        *pfVar5 = 0.0;
        *local_578 = 0.0;
      }
      fVar21 = *pfVar3;
      if ((fVar21 == 0.0) && (!NAN(fVar21))) {
        *local_5a0 = 0.0;
        *local_570 = 0.0;
      }
      puts("\nIn calc_statistics");
      printf("%d full velocities\n",(ulong)uVar7);
      printf("%d positons without full velocity\n",(ulong)local_5a4);
      uVar1 = local_5b0;
      printf("%d positions in total\n",(ulong)local_5b0);
      printf("%d least squares normal velocities\n",(ulong)uVar8);
      printf("%d positons without least squares normal velocity\n",(ulong)local_5ac);
      printf("%d positions with full or least squares normal velocity\n",
             (ulong)(uVar1 - (uVar8 + uVar7)));
      printf("%d raw normal velocities\n",local_5d8);
      printf("%d positons without raw normal velocity\n",(ulong)local_5a8);
      __stream = fopen("lucas.plot.data","w");
      fprintf(__stream,"%d\n",0x19);
      if (RAW_STATISTICS != 0) {
        puts("\n                             Raw Normal Velocity Analysis");
        puts("\n                                  Histogram Error\n");
        for (lVar12 = 0; lVar12 != 0x19; lVar12 = lVar12 + 1) {
          printf("Bin:%5.2f Average Error:%8.5f St. Dev:%8.5f Count:%5d Density:%6.3f\n");
          fprintf(__stream,"%f %f %f %f\n",SUB84((double)(int)lVar12 + 0.5,0));
        }
        fwrite("\n\n\n",3,1,__stream);
        fprintf(__stream,"%d\n",0x19);
        puts("\n                                 Cumulative Error\n");
        fVar21 = 0.0;
        fVar22 = 0.0;
        uVar7 = 0;
        for (lVar12 = 0; lVar12 != 0x19; lVar12 = lVar12 + 1) {
          fVar21 = fVar21 + histogram_error2[lVar12];
          fVar22 = fVar22 + histogram_error[lVar12];
          uVar7 = uVar7 + histogram_count[lVar12];
        }
        for (lVar12 = 0; lVar12 != 0x19; lVar12 = lVar12 + 1) {
          fVar17 = fVar22 / (float)(int)uVar7;
          dVar20 = 0.0;
          fVar18 = 0.0;
          if (1 < (int)uVar7) {
            fVar18 = (fVar21 - (float)(int)uVar7 * fVar17 * fVar17) / (float)(int)(uVar7 - 1);
          }
          if (uVar7 != 0) {
            dVar20 = (double)fVar17;
          }
          printf("Bin:>%5.2f Average Error:%8.5f St. Dev:%8.5f Count:%5d Density:%6.3f\n",
                 (ulong)uVar7);
          fprintf(__stream,"%f %f %f %f\n",SUB84((double)(int)lVar12,0),dVar20,
                  (double)SQRT(ABS(fVar18)));
          fVar21 = fVar21 - histogram_error2[lVar12];
          fVar22 = fVar22 - histogram_error[lVar12];
          uVar7 = uVar7 - histogram_count[lVar12];
        }
        fputc(10,__stream);
        fclose(__stream);
      }
      fflush(_stdout);
      return;
    }
    local_4f0 = lVar12;
    for (lVar13 = 0; lVar15 + lVar13 < (long)(pic_y - n); lVar13 = lVar13 + 1) {
      fVar18 = *(float *)(lVar11 + -4 + lVar13 * 8);
      if ((fVar18 != 100.0) || (NAN(fVar18))) {
        fVar17 = *(float *)(lVar11 + lVar13 * 8);
        if ((fVar17 == 100.0) && (!NAN(fVar17))) goto LAB_0010355e;
        local_5b8 = *(undefined8 *)(lVar10 + lVar13 * 8);
        uve[0] = fVar18;
        uve[1] = fVar17;
        fVar17 = PsiER(uve,(float *)&local_5b8);
        *local_520 = *local_520 + fVar17;
        fVar18 = *(float *)(local_588 + lVar13 * 4);
        if ((fVar18 == 100.0) && (!NAN(fVar18))) {
          puts("Fatal error: E has no value");
          exit(1);
        }
        *local_538 = fVar18 + *local_538;
        if (fVar17 < *local_580) {
          *local_580 = fVar17;
        }
        uVar7 = uVar7 + 1;
        local_568 = CONCAT44(local_568._4_4_,(float)local_568 + fVar17 * fVar17);
        if (*local_530 <= fVar17 && fVar17 != *local_530) {
          *local_530 = fVar17;
        }
      }
      else {
LAB_0010355e:
        local_5a4 = local_5a4 + 1;
      }
      fVar18 = *(float *)(lVar14 + -4 + lVar13 * 8);
      if ((fVar18 != 100.0) || (NAN(fVar18))) {
        fVar17 = *(float *)(lVar14 + lVar13 * 8);
        if ((fVar17 == 100.0) && (!NAN(fVar17))) goto LAB_00103619;
        local_5b8 = *(undefined8 *)(lVar10 + lVar13 * 8);
        uve[0] = fVar18;
        uve[1] = fVar17;
        fVar18 = PsiEN(uve,(float *)&local_5b8);
        *local_598 = *local_598 + fVar18;
        if (fVar18 < *local_578) {
          *local_578 = fVar18;
        }
        uVar8 = uVar8 + 1;
        fVar21 = fVar21 + fVar18 * fVar18;
        if (*local_528 <= fVar18 && fVar18 != *local_528) {
          *local_528 = fVar18;
        }
      }
      else {
LAB_00103619:
        local_5ac = local_5ac + 1;
      }
      fVar18 = *(float *)(lVar16 + -4 + lVar13 * 8);
      if ((fVar18 != 100.0) || (NAN(fVar18))) {
        fVar17 = *(float *)(lVar16 + lVar13 * 8);
        if ((fVar17 == 100.0) && (!NAN(fVar17))) goto LAB_0010371d;
        local_5b8 = *(undefined8 *)(lVar10 + lVar13 * 8);
        uve[0] = fVar18;
        uve[1] = fVar17;
        fVar18 = PsiEN(uve,(float *)&local_5b8);
        *local_590 = *local_590 + fVar18;
        if (fVar18 < *local_570) {
          *local_570 = fVar18;
        }
        if (*local_5a0 <= fVar18 && fVar18 != *local_5a0) {
          *local_5a0 = fVar18;
        }
        local_5d8 = (ulong)((int)local_5d8 + 1);
        fVar22 = fVar22 + fVar18 * fVar18;
        iVar9 = (int)*(float *)(local_518 + lVar13 * 4);
        if (0x18 < iVar9) {
          iVar9 = 0x19;
        }
        histogram_error[iVar9] = histogram_error[iVar9] + fVar18;
        histogram_error2[iVar9] = fVar18 * fVar18 + histogram_error2[iVar9];
        histogram_count[iVar9] = histogram_count[iVar9] + 1;
      }
      else {
LAB_0010371d:
        local_5a8 = local_5a8 + 1;
      }
    }
    lVar12 = local_4f0 + 1;
    lVar11 = lVar11 + 0x1000;
    lVar10 = lVar10 + 0x1000;
    local_588 = local_588 + 0x800;
    lVar14 = lVar14 + 0x1000;
    lVar16 = lVar16 + 0x1000;
    local_518 = local_518 + 0x800;
    local_5b0 = local_5b0 + (int)lVar13;
  } while( true );
}

Assistant:

void calc_statistics(float correct_vels[PIC_X][PIC_Y][2],
				float norm_vels1[PIC_X][PIC_Y][2],
				float norm_vels2[PIC_X][PIC_Y][2],
				int int_size_x, int int_size_y,
				float full_vels[PIC_X][PIC_Y][2],
				float E[PIC_X][PIC_Y], int pic_x,
				int pic_y, int n, float *ave_error,
				float *st_dev,float *density, float *residual,
				float *min_angle, float *max_angle,
				float *norm_ave_error1,float *norm_st_dev1,
				float *norm_density1, float *norm_min_angle1,
				float *norm_max_angle1, float *norm_ave_error2,
				float *norm_st_dev2, float *norm_density2,
				float *norm_min_angle2, float *norm_max_angle2)
{
FILE *fp;
int full_count,norm_count1,no_full_count,no_norm_count1,i,j,total_count;
int norm_count2,no_norm_count2;
float normal_sumX2_1,normal_sumX2_2,sumX2,temp,uva[2],uve[2],bin_err2;
float histogram_error[100],histogram_error2[100],bin_sum,bin_ave,bin_st_dev;
float bin_density;
int histogram_count[100],int_mag,bin_ct;

full_count = norm_count1 = norm_count2 = no_full_count = no_norm_count1 = no_norm_count2 = total_count = 0;
normal_sumX2_1 = normal_sumX2_2 = sumX2 = 0.0;
(*norm_min_angle1) = (*min_angle) = (float) HUGE_VAL;
(*norm_max_angle1) = (*max_angle) = 0.0f;
(*norm_min_angle2) = (float) HUGE_VAL;
(*norm_max_angle2) = 0.0f;
(*ave_error) = (*st_dev) = (*density) = (*residual) = 0.0f;
(*norm_ave_error1) = (*norm_st_dev1) = (*norm_density1) = 0.0f;
(*norm_ave_error2) = (*norm_st_dev2) = (*norm_density2) = 0.0f;

for(i=0;i<100;i++) { histogram_error[i]=histogram_error2[i]=0.0; histogram_count[i]=0; }


for(i=n;i<pic_x-n;i++)
{
for(j=n;j<pic_y-n;j++)
	{
	if(full_vels[i][j][0] != NO_VALUE && full_vels[i][j][1] != NO_VALUE)
	  {
	  full_count++;
	  uve[0] = full_vels[i][j][0]; uve[1] = full_vels[i][j][1];
	  uva[0] = correct_vels[i][j][0]; uva[1] = correct_vels[i][j][1];
	  temp = PsiER(uve,uva);
	  (*ave_error) += temp;
	  if(E[i][j] == NO_VALUE)
		{ printf("Fatal error: E has no value\n"); exit(1); }
	  (*residual) += E[i][j];
	  sumX2 += temp*temp;
	  if(temp < (*min_angle)) (*min_angle) = temp;
	  if(temp > (*max_angle)) (*max_angle) = temp;
	  }
	else no_full_count++;

	if(norm_vels1[i][j][0] != NO_VALUE && norm_vels1[i][j][1] != NO_VALUE)
	  {
	  norm_count1++;
	  uve[0] = norm_vels1[i][j][0]; uve[1] = norm_vels1[i][j][1];
	  uva[0] = correct_vels[i][j][0]; uva[1] = correct_vels[i][j][1];
	  temp = PsiEN(uve,uva);
	  (*norm_ave_error1) += temp;
	  normal_sumX2_1 += temp*temp;
	  if(temp < (*norm_min_angle1)) (*norm_min_angle1) = temp;
	  if(temp > (*norm_max_angle1)) (*norm_max_angle1) = temp;
	  }
	else no_norm_count1++;

	if(norm_vels2[i][j][0] != NO_VALUE && norm_vels2[i][j][1] != NO_VALUE)
	  {
	  norm_count2++;
	  uve[0] = norm_vels2[i][j][0]; uve[1] = norm_vels2[i][j][1];
	  uva[0] = correct_vels[i][j][0]; uva[1] = correct_vels[i][j][1];
	  temp = PsiEN(uve,uva);
	  (*norm_ave_error2) += temp;
	  normal_sumX2_2 += temp*temp;
	  if(temp < (*norm_min_angle2)) (*norm_min_angle2) = temp;
	  if(temp > (*norm_max_angle2)) (*norm_max_angle2) = temp;
	  int_mag = (int) (Imag[i][j]);
	  if(int_mag >= MAX_I) int_mag = MAX_I;
	  histogram_error[int_mag] += temp;
	  histogram_error2[int_mag] += temp*temp;
	  histogram_count[int_mag]++;
	  }
	else no_norm_count2++;

	total_count++;
	}
}
(*density) = (full_count*100.0f)/(total_count);
(*norm_density1) = (norm_count1*100.0f)/(total_count);
(*norm_density2) = (norm_count2*100.0f)/(total_count);

if(full_count != 0) (*ave_error) = (*ave_error)/full_count;
else (*ave_error) = 0.0;
if(norm_count1 != 0) (*norm_ave_error1) = (*norm_ave_error1)/norm_count1;
else (*norm_ave_error1) = 0.0;
if(norm_count2 != 0) (*norm_ave_error2) = (*norm_ave_error2)/norm_count2;
else (*norm_ave_error2) = 0.0;

if(full_count > 1)
{
temp =(float) (fabs((sumX2 - full_count*(*ave_error)*(*ave_error))/(full_count-1)));
(*st_dev) = (float) sqrt(temp);
}
else (*st_dev) = 0.0f;
if(norm_count1 > 1)
(*norm_st_dev1) = (float) (sqrt((normal_sumX2_1 - norm_count1*(*norm_ave_error1)*(*norm_ave_error1))/(norm_count1-1)));
else (*norm_st_dev1) = 0.0;
if(norm_count2 > 1)
(*norm_st_dev2) = (float) (sqrt((normal_sumX2_2 - norm_count2*(*norm_ave_error2)*(*norm_ave_error2))/(norm_count2-1)));
else (*norm_st_dev2) = 0.0;

if(full_count != 0) (*residual) = (*residual)/full_count;
if((*ave_error) == 0.0) { (*min_angle) = (*max_angle) = 0.0; }
if((*norm_ave_error1) == 0.0) { (*norm_min_angle1) = (*norm_max_angle1) = 0.0; }
if((*norm_ave_error2) == 0.0) { (*norm_min_angle2) = (*norm_max_angle2) = 0.0; }

printf("\nIn calc_statistics\n");
printf("%d full velocities\n",full_count);
printf("%d positons without full velocity\n",no_full_count);
printf("%d positions in total\n",total_count);
printf("%d least squares normal velocities\n",norm_count1);
printf("%d positons without least squares normal velocity\n",no_norm_count1);
printf("%d positions with full or least squares normal velocity\n",
	total_count-full_count-norm_count1);
printf("%d raw normal velocities\n",norm_count2);
printf("%d positons without raw normal velocity\n",no_norm_count2);

fp =fopen("lucas.plot.data","w");
fprintf(fp,"%d\n",MAX_I);
if(RAW_STATISTICS)
{
printf("\n                             Raw Normal Velocity Analysis\n");
printf("\n                                  Histogram Error\n\n");
for(i=0;i<MAX_I;i++)
	{
     	if(histogram_count[i] != 0.0) bin_ave = histogram_error[i]/(histogram_count[i]*1.0f);
     	else bin_ave = 0.0;
	if(histogram_count[i] > 1) temp = ((histogram_error2[i]-histogram_count[i]*bin_ave*bin_ave)/(histogram_count[i]-1.0f));
	else temp = 0.0;
	bin_density = histogram_count[i]*100.0f/total_count;
	bin_st_dev = (float) sqrt(fabs(temp));
     	printf("Bin:%5.2f Average Error:%8.5f St. Dev:%8.5f Count:%5d Density:%6.3f\n",i+0.5,bin_ave,bin_st_dev,histogram_count[i],bin_density);
     	fprintf(fp,"%f %f %f %f\n",i+0.5,bin_ave,bin_st_dev,bin_density);
	}
fprintf(fp,"\n\n\n");
fprintf(fp,"%d\n",MAX_I);
printf("\n                                 Cumulative Error\n\n");
bin_sum = 0.0; bin_ct=0; bin_err2 = 0.0;
for(i=0;i<MAX_I;i++)
     {
     bin_sum += histogram_error[i];
     bin_err2 += histogram_error2[i];
     bin_ct += histogram_count[i];
     }
for(i=0;i<MAX_I;i++)
     {
     if(bin_ct != 0) bin_ave = bin_sum/bin_ct; else bin_ave = 0.0;
     bin_density = bin_ct*100.0f/total_count;
     if(bin_ct > 1)  temp = ((bin_err2-bin_ct*bin_ave*bin_ave)/(bin_ct-1));
     else temp = 0.0;
     bin_st_dev = (float) sqrt(fabs(temp));
     printf("Bin:>%5.2f Average Error:%8.5f St. Dev:%8.5f Count:%5d Density:%6.3f\n",i*1.0,bin_ave,bin_st_dev,bin_ct,bin_density);
     fprintf(fp,"%f %f %f %f\n",i*1.0,bin_ave,bin_st_dev,bin_density);
     bin_sum -= histogram_error[i];
     bin_err2 -= histogram_error2[i];
     bin_ct -= histogram_count[i];
     }
fprintf(fp,"\n");
fclose(fp);
}
fflush(stdout);
}